

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_scalar_functions.hpp
# Opt level: O2

void sum_cols_int(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  int iVar2;
  int i;
  long lVar3;
  int argc_local;
  int local_cc;
  SourceLineInfo local_c8;
  BinaryExpr<const_int_&,_const_int_&> local_b8;
  AssertionHandler catchAssertionHandler;
  StringRef local_40;
  
  local_b8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1703dc;
  local_b8.super_ITransientExpression.m_isBinaryExpression = true;
  local_b8.super_ITransientExpression.m_result = false;
  local_b8.super_ITransientExpression._10_6_ = 0;
  local_c8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
  ;
  local_c8.line = 0xf;
  argc_local = argc;
  Catch::StringRef::StringRef(&local_40,"argc > 0");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_b8,&local_c8,local_40,Normal);
  local_cc = 0;
  local_c8.file = (char *)&argc_local;
  Catch::ExprLhs<int_const&>::operator>(&local_b8,(ExprLhs<int_const&> *)&local_c8,&local_cc);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_b8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_b8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  iVar1 = duckdb_shell_sqlite3_value_int(*argv);
  for (lVar3 = 1; lVar3 < argc_local; lVar3 = lVar3 + 1) {
    iVar2 = duckdb_shell_sqlite3_value_int(argv[lVar3]);
    iVar1 = iVar1 + iVar2;
  }
  duckdb_shell_sqlite3_result_int(context,iVar1);
  return;
}

Assistant:

static void sum_cols_int(sqlite3_context *context, int argc, sqlite3_value **argv) {
	REQUIRE(argc > 0);
	auto sum = sqlite3_value_int(argv[0]);
	for (int i = 1; i < argc; ++i) {
		sum += sqlite3_value_int(argv[i]);
	}
	sqlite3_result_int(context, sum);
}